

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double Alg::productLog(double realz,double imagez)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __x_00;
  double __y;
  double dVar5;
  double dVar6;
  double local_a8;
  double w;
  double dStack_98;
  int loopn;
  double error;
  double y0;
  double x0;
  double y;
  double x;
  double temp;
  double Fy [2];
  double Fx [2];
  double F [2];
  double zy;
  double zx;
  double lnx;
  double imagez_local;
  double realz_local;
  
  realz_local = realz;
  if (1e-10 <= ABS(realz) + ABS(imagez)) {
    __x = log(realz);
    x0 = 0.0;
    dVar1 = log(__x * __x + 0.0);
    temp = (dVar1 / 2.0 + __x) - __x;
    dVar1 = atan2(0.0,__x);
    Fy[0] = dVar1 + 0.0;
    dStack_98 = ABS(temp) + ABS(Fy[0]);
    local_a8 = 1.0;
    y = __x;
    while (-1.05 < local_a8 && 1e-10 < dStack_98) {
      dVar1 = y * y + x0 * x0;
      dVar2 = y / dVar1 + 1.0;
      dVar1 = x0 / dVar1;
      dVar3 = dVar2 * dVar2 + dVar1 * dVar1;
      dVar6 = Fy[0] * dVar1;
      dVar4 = temp * dVar2;
      dVar1 = temp * dVar1;
      dVar2 = Fy[0] * dVar2;
      local_a8 = 1.0;
      while (-1.0 <= local_a8) {
        __x_00 = -local_a8 * ((dVar4 + -dVar6) / dVar3) + y;
        __y = -local_a8 * ((dVar2 + -dVar1) / dVar3) + x0;
        dVar5 = log(__x_00 * __x_00 + __y * __y);
        temp = (dVar5 / 2.0 + __x_00) - __x;
        dVar5 = atan2(__y,__x_00);
        Fy[0] = (__y - 0.0) + dVar5;
        if (dStack_98 <= ABS(temp) + ABS(Fy[0])) {
          local_a8 = local_a8 - 0.1;
        }
        else {
          local_a8 = -1.03;
          dStack_98 = ABS(temp) + ABS(Fy[0]);
          x0 = __y;
          y = __x_00;
        }
      }
    }
    realz_local = y;
  }
  return realz_local;
}

Assistant:

double Alg::productLog(double realz, double imagez) {
    if (fabs(realz) + fabs(imagez) < 1e-10) {
        return realz;
    }
    double lnx = log(realz);
    double zx = lnx;
    double zy = 0;
    double F[2];
    double Fx[2];
    double Fy[2];
    double temp = 0;
    double x = zx;
    double y = zy;
    double x0 = 0;
    double y0 = 0;
    Fy[0] = log(x * x + y * y) / 2 + x - zx;
    Fy[1] = y - zy + atan2(y, x);
    double error = fabs(Fy[0]) + fabs(Fy[1]);
    int loopn = 1000;
    double w = 1;
    while (loopn > 0 && w > -1.05 && error > 1e-10) {
        w = x * x + y * y;
        F[0] = x / w + 1;
        F[1] = y / w;
        w = F[0] * F[0] + F[1] * F[1];
        Fx[0] = (Fy[0] * F[0] - Fy[1] * F[1]) / w;
        Fx[1] = (Fy[1] * F[0] - Fy[0] * F[1]) / w;
        w = 1;
        while (w >= -1){
            x0 = x - w * Fx[0];
            y0 = y - w * Fx[1];
            Fy[0] = log(x0 * x0 + y0 * y0) / 2 + x0 - zx;
            Fy[1] = y0 - zy + atan2(y0, x0);
            temp = fabs(Fy[0]) + fabs(Fy[1]);
            if (temp < error) {
                error = temp;
                x = x0;
                y = y0;
                w = -1.03;
            }
            else {
                w = w - 0.1;
            }
        }
    }
    return x;
}